

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

int __thiscall
phmap::priv::
base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
::verify(base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
         *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  _Rb_tree_header *p_Var1;
  int extraout_EAX;
  template_ElementType<2UL> *ptVar2;
  reference x;
  _Rb_tree_const_iterator<long> _Var3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  const_iterator cVar7;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
  tree_iter;
  AssertionResult gtest_ar_3;
  const_reverse_iterator tree_riter;
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
  local_90;
  AssertHelper local_80;
  iterator checker_iter;
  AssertionResult gtest_ar;
  reverse_iterator checker_riter;
  reverse_iterator<std::_Rb_tree_const_iterator<long>_> local_48;
  undefined8 uStack_40;
  
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::verify
            ((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)this,ctx,sig,siglen,tbs,tbslen);
  tree_riter.current.node =
       (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
        *)(this->tree_).
          super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
          .tree_.size_;
  gtest_ar_3._0_8_ = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"tree_.size()","checker_.size()",(unsigned_long *)&tree_riter,
             (unsigned_long *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tree_riter);
    if ((undefined8 *)
        CONCAT44(gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 (int)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  (int)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x112,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree_riter);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (tree_riter.current.node !=
        (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)tree_riter.current.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  checker_iter._M_node = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cVar7 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                   *)this);
  gtest_ar.success_ = cVar7.node._0_1_;
  gtest_ar._1_7_ = cVar7.node._1_7_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = cVar7.position;
  while( true ) {
    cVar7 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                   *)this);
    if ((int)gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl == cVar7.position &&
        (btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
         *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) ==
        (btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
         *)cVar7.node) break;
    lVar6 = (long)(int)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
    ptVar2 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
                              *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    (anonymous_namespace)::CheckPairEquals<long,long>
              (ptVar2 + lVar6,(long *)(checker_iter._M_node + 1));
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
    ::increment((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
                 *)&gtest_ar);
    checker_iter._M_node = (_Base_ptr)std::_Rb_tree_increment(checker_iter._M_node);
  }
  for (iVar4 = (int)(this->tree_).
                    super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
                    .tree_.size_; 0 < iVar4; iVar4 = iVar4 + -1) {
    tree_iter.node._1_7_ = gtest_ar._1_7_;
    tree_iter.node._0_1_ = gtest_ar.success_;
    tree_iter.position =
         (int)gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    tree_iter._12_4_ = 0;
    base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
    ::
    iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>,std::_Rb_tree_const_iterator<long>>
              ((base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
                *)this,tree_iter,(_Rb_tree_const_iterator<long>)checker_iter._M_node);
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
    ::decrement((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
                 *)&gtest_ar);
    checker_iter._M_node = (_Base_ptr)std::_Rb_tree_decrement(checker_iter._M_node);
  }
  cVar7 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                   *)this);
  gtest_ar_3._0_8_ = cVar7.node;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = cVar7.position;
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>
            ((internal *)&tree_riter,"tree_iter","tree_.begin()",
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
              *)&gtest_ar,
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
              *)&gtest_ar_3);
  if ((char)tree_riter.current.node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x121,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tree_riter.current.position);
  gtest_ar_3._0_8_ = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_const_iterator<long>,std::_Rb_tree_const_iterator<long>>
            ((internal *)&tree_riter,"checker_iter","checker_.begin()",&checker_iter,
             (_Rb_tree_const_iterator<long> *)&gtest_ar_3);
  if ((char)tree_riter.current.node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x122,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tree_riter.current.position);
  p_Var1 = &(this->checker_)._M_t._M_impl.super__Rb_tree_header;
  checker_riter.current._M_node =
       (_Rb_tree_const_iterator<long>)(_Rb_tree_const_iterator<long>)p_Var1;
  cVar7 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)this);
  tree_riter.current.node = cVar7.node;
  tree_riter.current.position = cVar7.position;
  _Var3._M_node = &p_Var1->_M_header;
  while( true ) {
    cVar7 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                     *)this);
    if ((tree_riter.current.node == cVar7.node) && (tree_riter.current.position == cVar7.position))
    break;
    x = std::
        reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
        ::operator*((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
                     *)&tree_riter.current);
    lVar6 = std::_Rb_tree_decrement(_Var3._M_node);
    (anonymous_namespace)::CheckPairEquals<long,long>(x,(long *)(lVar6 + 0x20));
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
    ::decrement(&tree_riter.current);
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_decrement(_Var3._M_node);
    checker_riter.current._M_node =
         (_Rb_tree_const_iterator<long>)(_Rb_tree_const_iterator<long>)_Var3._M_node;
  }
  for (iVar4 = (int)(this->tree_).
                    super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
                    .tree_.size_; 0 < iVar4; iVar4 = iVar4 + -1) {
    uStack_40 = CONCAT44(tree_riter.current._12_4_,tree_riter.current.position);
    local_48.current._M_node =
         (_Rb_tree_const_iterator<long>)(_Rb_tree_const_iterator<long>)tree_riter.current.node;
    base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
    ::
    riter_check<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>,std::reverse_iterator<std::_Rb_tree_const_iterator<long>>>
              ((base_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
                *)&gtest_ar_3,
               (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>_>
                *)this,&local_48);
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_const_long_&,_const_long_*>
    ::increment(&tree_riter.current);
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
    checker_riter.current._M_node =
         (_Rb_tree_const_iterator<long>)(_Rb_tree_const_iterator<long>)_Var3._M_node;
  }
  cVar7 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)this);
  local_90.current.node = cVar7.node;
  local_90.current.position = cVar7.position;
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>,std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>const,long_const&,long_const*>>>
            ((internal *)&gtest_ar_3,"tree_riter","tree_.rbegin()",&tree_riter,&local_90);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)
        CONCAT44(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 (int)gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  (int)gtest_ar_3.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x131,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.current.node !=
        (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  local_90.current.node =
       (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
        *)p_Var1;
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<std::_Rb_tree_const_iterator<long>>,std::reverse_iterator<std::_Rb_tree_const_iterator<long>>>
            ((internal *)&gtest_ar_3,"checker_riter","checker_.rbegin()",&checker_riter,
             (reverse_iterator<std::_Rb_tree_const_iterator<long>_> *)&local_90);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)
        CONCAT44(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 (int)gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  (int)gtest_ar_3.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x132,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.current.node !=
        (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  return extraout_EAX;
}

Assistant:

void verify() const {
        tree_.verify();
        EXPECT_EQ(tree_.size(), checker_.size());

        // Move through the forward iterators using increment.
        auto checker_iter = checker_.begin();
        const_iterator tree_iter(tree_.begin());
        for (; tree_iter != tree_.end(); ++tree_iter, ++checker_iter) {
            CheckPairEquals(*tree_iter, *checker_iter);
        }

        // Move through the forward iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            iter_check(tree_iter, checker_iter);
            --tree_iter;
            --checker_iter;
        }
        EXPECT_EQ(tree_iter, tree_.begin());
        EXPECT_EQ(checker_iter, checker_.begin());

        // Move through the reverse iterators using increment.
        auto checker_riter = checker_.rbegin();
        const_reverse_iterator tree_riter(tree_.rbegin());
        for (; tree_riter != tree_.rend(); ++tree_riter, ++checker_riter) {
            CheckPairEquals(*tree_riter, *checker_riter);
        }

        // Move through the reverse iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            riter_check(tree_riter, checker_riter);
            --tree_riter;
            --checker_riter;
        }
        EXPECT_EQ(tree_riter, tree_.rbegin());
        EXPECT_EQ(checker_riter, checker_.rbegin());
    }